

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void UpdateModel(CPpmd8 *p)

{
  byte bVar1;
  Byte BVar2;
  byte bVar3;
  ushort uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Byte *pBVar11;
  CTX_PTR pCVar12;
  UInt32 *pUVar13;
  undefined4 *puVar14;
  CPpmd_State *p_00;
  CPpmd_State *s2_1;
  CPpmd_State *s2;
  UInt32 *pUStack_88;
  UInt32 n;
  UInt32 *z;
  UInt32 *d;
  void *oldPtr;
  void *ptr;
  uint i;
  uint oldNU;
  UInt32 sf;
  UInt32 cf;
  uint ns1;
  CTX_PTR cs_2;
  CTX_PTR cs_1;
  CTX_PTR cs;
  CPpmd_State *s;
  Byte fSymbol;
  Byte flag;
  uint fFreq;
  uint ns;
  uint s0;
  CTX_PTR c;
  CPpmd_Void_Ref fSuccessor;
  CPpmd_Void_Ref successor;
  CPpmd8 *p_local;
  
  c._0_4_ = CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow);
  uVar6 = (uint)p->FoundState->Freq;
  bVar1 = p->FoundState->Symbol;
  cs = (CTX_PTR)0x0;
  if ((p->FoundState->Freq < 0x1f) && (p->MinContext->Suffix != 0)) {
    pBVar11 = p->Base + p->MinContext->Suffix;
    if (*pBVar11 == '\0') {
      cs = (CTX_PTR)(pBVar11 + 2);
      if (pBVar11[3] < 0x20) {
        pBVar11[3] = pBVar11[3] + '\x01';
      }
    }
    else {
      pCVar12 = (CTX_PTR)(p->Base + *(uint *)(pBVar11 + 4));
      if (pCVar12->NumStats != p->FoundState->Symbol) {
        do {
          cs = pCVar12;
          pCVar12 = (CTX_PTR)((long)&cs->Stats + 2);
        } while (pCVar12->NumStats != p->FoundState->Symbol);
        if (cs->Flags <= *(byte *)((long)&cs->Stats + 3)) {
          SwapStates((CPpmd_State *)pCVar12,(CPpmd_State *)cs);
          pCVar12 = cs;
        }
      }
      cs = pCVar12;
      if (cs->Flags < 0x73) {
        cs->Flags = cs->Flags + '\x02';
        *(short *)(pBVar11 + 2) = *(short *)(pBVar11 + 2) + 2;
      }
    }
  }
  _ns = p->MaxContext;
  if ((p->OrderFall == 0) && ((uint)c != 0)) {
    pCVar12 = CreateSuccessors(p,1,(CPpmd_State *)cs,p->MinContext);
    if (pCVar12 == (CTX_PTR)0x0) {
      SetSuccessor(p->FoundState,0);
      RestoreModel(p,_ns);
    }
    else {
      SetSuccessor(p->FoundState,(int)pCVar12 - (int)p->Base);
      p->MaxContext = pCVar12;
    }
  }
  else {
    BVar2 = p->FoundState->Symbol;
    pBVar11 = p->Text;
    p->Text = pBVar11 + 1;
    *pBVar11 = BVar2;
    c._4_4_ = (int)p->Text - (int)p->Base;
    if (p->Text < p->UnitsStart) {
      if ((uint)c == 0) {
        pCVar12 = ReduceOrder(p,(CPpmd_State *)cs,p->MinContext);
        if (pCVar12 == (CTX_PTR)0x0) {
          RestoreModel(p,_ns);
          return;
        }
        c._0_4_ = (int)pCVar12 - (int)p->Base;
      }
      else if (p->Base + (uint)c < p->UnitsStart) {
        pCVar12 = CreateSuccessors(p,0,(CPpmd_State *)cs,p->MinContext);
        if (pCVar12 == (CTX_PTR)0x0) {
          RestoreModel(p,_ns);
          return;
        }
        c._0_4_ = (int)pCVar12 - (int)p->Base;
      }
      uVar7 = p->OrderFall - 1;
      p->OrderFall = uVar7;
      if (uVar7 == 0) {
        c._4_4_ = (uint)c;
        p->Text = p->Text + -(long)(int)(uint)(p->MaxContext != p->MinContext);
      }
      uVar4 = p->MinContext->SummFreq;
      uVar7 = (uint)p->MinContext->NumStats;
      for (; _ns != p->MinContext; _ns = (CTX_PTR)(p->Base + _ns->Suffix)) {
        bVar3 = _ns->NumStats;
        uVar8 = (uint)bVar3;
        if (uVar8 == 0) {
          puVar14 = (undefined4 *)AllocUnits(p,0);
          if (puVar14 == (undefined4 *)0x0) {
            RestoreModel(p,_ns);
            return;
          }
          *puVar14 = *(undefined4 *)&_ns->SummFreq;
          *(undefined2 *)(puVar14 + 1) = *(undefined2 *)((long)&_ns->Stats + 2);
          _ns->Stats = (int)puVar14 - (int)p->Base;
          if (*(byte *)((long)puVar14 + 1) < 0x1e) {
            *(char *)((long)puVar14 + 1) = *(char *)((long)puVar14 + 1) << 1;
          }
          else {
            *(undefined1 *)((long)puVar14 + 1) = 0x78;
          }
          _ns->SummFreq =
               (ushort)*(byte *)((long)puVar14 + 1) + (short)p->InitEsc + (ushort)(2 < uVar7);
        }
        else {
          if ((bVar3 & 1) != 0) {
            s2._4_4_ = uVar8 + 1 >> 1;
            uVar9 = (uint)p->Units2Indx[s2._4_4_ - 1];
            if (uVar9 != p->Units2Indx[s2._4_4_]) {
              pUVar13 = (UInt32 *)AllocUnits(p,uVar9 + 1);
              if (pUVar13 == (UInt32 *)0x0) {
                RestoreModel(p,_ns);
                return;
              }
              pBVar11 = p->Base;
              uVar10 = _ns->Stats;
              pUStack_88 = (UInt32 *)(pBVar11 + uVar10);
              z = pUVar13;
              do {
                *z = *pUStack_88;
                z[1] = pUStack_88[1];
                z[2] = pUStack_88[2];
                pUStack_88 = pUStack_88 + 3;
                z = z + 3;
                s2._4_4_ = s2._4_4_ - 1;
              } while (s2._4_4_ != 0);
              InsertNode(p,pBVar11 + uVar10,uVar9);
              _ns->Stats = (int)pUVar13 - (int)p->Base;
            }
          }
          _ns->SummFreq = _ns->SummFreq + (ushort)(uVar8 * 3 + 1 < uVar7);
        }
        uVar9 = uVar6 * 2 * (_ns->SummFreq + 6);
        uVar10 = ((uVar4 - uVar7) - uVar6) + (uint)_ns->SummFreq;
        if (uVar9 < uVar10 * 6) {
          oldNU = (uVar10 < uVar9) + 1 + (uint)(uVar10 * 4 <= uVar9);
          _ns->SummFreq = _ns->SummFreq + 4;
        }
        else {
          oldNU = (uVar10 * 9 < uVar9) + 4 + (uint)(uVar10 * 0xc < uVar9) +
                  (uint)(uVar10 * 0xf < uVar9);
          _ns->SummFreq = _ns->SummFreq + (short)oldNU;
        }
        pBVar11 = p->Base;
        lVar5 = (ulong)uVar8 * 6 + (ulong)_ns->Stats;
        p_00 = (CPpmd_State *)(pBVar11 + lVar5 + 6);
        SetSuccessor(p_00,c._4_4_);
        p_00->Symbol = bVar1;
        pBVar11[lVar5 + 7] = (Byte)oldNU;
        _ns->Flags = _ns->Flags | (0x3f < bVar1) << 3;
        _ns->NumStats = bVar3 + 1;
      }
      p->MinContext = (CPpmd8_Context *)(p->Base + (uint)c);
      p->MaxContext = (CPpmd8_Context *)(p->Base + (uint)c);
    }
    else {
      RestoreModel(p,_ns);
    }
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}